

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall cs::instance_type::dump_ast(instance_type *this,ostream *stream)

{
  _Elt_pointer ppsVar1;
  ostream *poVar2;
  statement_base **ptr;
  _Elt_pointer ppsVar3;
  _Elt_pointer ppsVar4;
  _Map_pointer pppsVar5;
  any local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"< Covariant Script AST Dump >\n< BeginMetaData >\n< Version: ",0x3b);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,*(char **)(current_process + 8),*(long *)(current_process + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," >\n< Standard Version: ",0x17);
  cs_impl::any::any<cs::numeric>(&local_30,(numeric *)(current_process + 0x30));
  poVar2 = operator<<(poVar2,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," >\n< Import Path: \"",0x13);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,*(char **)(current_process + 0x58),*(long *)(current_process + 0x60));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" >\n",4);
  cs_impl::any::recycle(&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"< Platform: Unix >\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"< EndMetaData >\n",0x10);
  ppsVar3 = (this->statements).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar1 = (this->statements).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar3 != ppsVar1) {
    ppsVar4 = (this->statements).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar5 = (this->statements).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppsVar3)->_vptr_statement_base[5])(*ppsVar3,stream);
      ppsVar3 = ppsVar3 + 1;
      if (ppsVar3 == ppsVar4) {
        ppsVar3 = pppsVar5[1];
        pppsVar5 = pppsVar5 + 1;
        ppsVar4 = ppsVar3 + 0x40;
      }
    } while (ppsVar3 != ppsVar1);
  }
  std::ostream::flush();
  return;
}

Assistant:

void instance_type::dump_ast(std::ostream &stream)
	{
		stream << "< Covariant Script AST Dump >\n< BeginMetaData >\n< Version: " << current_process->version
		       << " >\n< Standard Version: "
		       << current_process->std_version
		       << " >\n< Import Path: \""
		       << current_process->import_path
		       << "\" >\n";
#ifdef COVSCRIPT_PLATFORM_WIN32
		stream << "< Platform: Win32 >\n";
#else
		stream << "< Platform: Unix >\n";
#endif
		stream << "< EndMetaData >\n";
		for (auto &ptr: statements)
			ptr->dump(stream);
		stream << std::flush;
	}